

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

ModuleDefinitionInfo * __thiscall
cmGeneratorTarget::GetModuleDefinitionInfo(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  TargetType TVar4;
  iterator iVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>,_bool>
  pVar6;
  string config_upper;
  value_type entry;
  ModuleDefinitionInfo info;
  key_type local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
  local_d0;
  ModuleDefinitionInfo local_70;
  
  TVar4 = cmTarget::GetType(this->Target);
  if (((TVar4 != SHARED_LIBRARY) &&
      (TVar4 = cmTarget::GetType(this->Target), TVar4 != MODULE_LIBRARY)) &&
     (bVar3 = IsExecutableWithExports(this), !bVar3)) {
    return (ModuleDefinitionInfo *)0x0;
  }
  paVar1 = &local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_d0.first,config);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
      operator_delete(local_d0.first._M_dataplus._M_p,
                      local_d0.first.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>_>
          ::find(&(this->ModuleDefinitionInfoMap)._M_t,&local_f0);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header) {
    paVar2 = &local_70.DefFile.field_2;
    local_70.DefFile._M_string_length = 0;
    local_70.DefFile.field_2._M_local_buf[0] = '\0';
    local_70.Sources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.Sources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.Sources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.DefFile._M_dataplus._M_p = (pointer)paVar2;
    ComputeModuleDefinitionInfo(this,config,&local_70);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ModuleDefinitionInfo_&,_true>
              (&local_d0,&local_f0,&local_70);
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>>
            ::
            _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>>
                        *)&this->ModuleDefinitionInfoMap,&local_d0);
    iVar5._M_node = (_Base_ptr)pVar6.first._M_node;
    if (local_d0.second.Sources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.second.Sources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.second.Sources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.second.Sources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.second.DefFile._M_dataplus._M_p != &local_d0.second.DefFile.field_2) {
      operator_delete(local_d0.second.DefFile._M_dataplus._M_p,
                      local_d0.second.DefFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
      operator_delete(local_d0.first._M_dataplus._M_p,
                      local_d0.first.field_2._M_allocated_capacity + 1);
    }
    if (local_70.Sources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.Sources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.Sources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.Sources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.DefFile._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.DefFile._M_dataplus._M_p,
                      CONCAT71(local_70.DefFile.field_2._M_allocated_capacity._1_7_,
                               local_70.DefFile.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return (ModuleDefinitionInfo *)(iVar5._M_node + 2);
}

Assistant:

cmGeneratorTarget::ModuleDefinitionInfo const*
cmGeneratorTarget::GetModuleDefinitionInfo(std::string const& config) const
{
  // A module definition file only makes sense on certain target types.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  ModuleDefinitionInfoMapType::const_iterator i =
    this->ModuleDefinitionInfoMap.find(config_upper);
  if (i == this->ModuleDefinitionInfoMap.end()) {
    ModuleDefinitionInfo info;
    this->ComputeModuleDefinitionInfo(config, info);
    ModuleDefinitionInfoMapType::value_type entry(config_upper, info);
    i = this->ModuleDefinitionInfoMap.insert(entry).first;
  }
  return &i->second;
}